

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.cpp
# Opt level: O0

Error __thiscall
llvm::DWARFListTableHeader::extract
          (DWARFListTableHeader *this,DWARFDataExtractor Data,uint64_t *OffsetPtr)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t *in_RDX;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  Error local_110;
  uint64_t local_108;
  uint local_fc;
  char *pcStack_f8;
  uint32_t I;
  error_code local_f0;
  char *local_e0;
  error_code local_d8;
  char *local_c8;
  error_code local_c0;
  char *local_b0;
  error_code local_a8;
  char *local_98;
  error_code local_90;
  ulong local_80;
  uint64_t End;
  error_code local_70;
  ulong local_60;
  uint64_t FullLength;
  error_code local_50;
  byte local_39;
  char *pcStack_38;
  uint8_t OffsetByteSize;
  error_code local_30;
  uint64_t *local_20;
  uint64_t *OffsetPtr_local;
  DWARFListTableHeader *this_local;
  
  OffsetPtr[6] = *in_RDX;
  local_20 = in_RDX;
  OffsetPtr_local = OffsetPtr;
  this_local = this;
  bVar2 = DataExtractor::isValidOffsetForDataOfSize(&Data.super_DataExtractor,*in_RDX,4);
  if (bVar2) {
    *(undefined1 *)(OffsetPtr + 5) = 0;
    local_39 = 4;
    uVar7 = DWARFDataExtractor::getRelocatedValue(&Data,4,local_20,(uint64_t *)0x0,(Error *)0x0);
    *OffsetPtr = uVar7;
    if (*OffsetPtr == 0xffffffff) {
      *(undefined1 *)(OffsetPtr + 5) = 1;
      local_39 = 8;
      uVar7 = DataExtractor::getU64(&Data.super_DataExtractor,local_20,(Error *)0x0);
      *OffsetPtr = uVar7;
    }
    else if (0xffffffef < *OffsetPtr) {
      std::error_code::error_code<llvm::errc,void>(&local_50,invalid_argument);
      FullLength = (uint64_t)StringRef::data((StringRef *)(OffsetPtr + 7));
      EC_00._M_cat._0_4_ = local_50._M_value;
      EC_00._0_8_ = this;
      EC_00._M_cat._4_4_ = 0;
      createStringError<char_const*,unsigned_long,unsigned_long>
                (EC_00,(char *)local_50._M_cat,
                 (char **)
                 "%s table at offset 0x%lx has unsupported reserved unit length of value 0x%8.8lx",
                 &FullLength,OffsetPtr + 6);
      return (Error)(ErrorInfoBase *)this;
    }
    uVar7 = *OffsetPtr;
    bVar3 = dwarf::getUnitLengthFieldByteSize(*(DwarfFormat *)(OffsetPtr + 5));
    local_60 = uVar7 + bVar3;
    uVar8 = length((DWARFListTableHeader *)OffsetPtr);
    uVar1 = local_60;
    if (uVar7 + bVar3 != uVar8) {
      __assert_fail("FullLength == length()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFListTable.cpp"
                    ,0x2a,
                    "Error llvm::DWARFListTableHeader::extract(DWARFDataExtractor, uint64_t *)");
    }
    bVar3 = getHeaderSize(*(DwarfFormat *)(OffsetPtr + 5));
    if (uVar1 < bVar3) {
      std::error_code::error_code<llvm::errc,void>(&local_70,invalid_argument);
      End = (uint64_t)StringRef::data((StringRef *)(OffsetPtr + 7));
      EC_01._M_cat._0_4_ = local_70._M_value;
      EC_01._0_8_ = this;
      EC_01._M_cat._4_4_ = 0;
      createStringError<char_const*,unsigned_long,unsigned_long>
                (EC_01,(char *)local_70._M_cat,
                 (char **)
                 "%s table at offset 0x%lx has too small length (0x%lx) to contain a complete header"
                 ,&End,OffsetPtr + 6);
    }
    else {
      local_80 = OffsetPtr[6] + local_60;
      bVar2 = DataExtractor::isValidOffsetForDataOfSize
                        (&Data.super_DataExtractor,OffsetPtr[6],local_60);
      if (bVar2) {
        uVar5 = DataExtractor::getU16(&Data.super_DataExtractor,local_20,(Error *)0x0);
        *(uint16_t *)(OffsetPtr + 1) = uVar5;
        uVar4 = DataExtractor::getU8(&Data.super_DataExtractor,local_20,(Error *)0x0);
        *(uint8_t *)((long)OffsetPtr + 10) = uVar4;
        uVar4 = DataExtractor::getU8(&Data.super_DataExtractor,local_20,(Error *)0x0);
        *(uint8_t *)((long)OffsetPtr + 0xb) = uVar4;
        uVar6 = DataExtractor::getU32(&Data.super_DataExtractor,local_20,(Error *)0x0);
        uVar1 = local_80;
        *(uint32_t *)((long)OffsetPtr + 0xc) = uVar6;
        if ((short)OffsetPtr[1] == 5) {
          if ((*(char *)((long)OffsetPtr + 10) == '\x04') ||
             (*(char *)((long)OffsetPtr + 10) == '\b')) {
            if (*(char *)((long)OffsetPtr + 0xb) == '\0') {
              uVar7 = OffsetPtr[6];
              bVar3 = getHeaderSize(*(DwarfFormat *)(OffsetPtr + 5));
              if (uVar1 < uVar7 + bVar3 + (ulong)(*(int *)((long)OffsetPtr + 0xc) * (uint)local_39))
              {
                std::error_code::error_code<llvm::errc,void>(&local_f0,invalid_argument);
                pcStack_f8 = StringRef::data((StringRef *)(OffsetPtr + 7));
                EC_06._M_cat._0_4_ = local_f0._M_value;
                EC_06._0_8_ = this;
                EC_06._M_cat._4_4_ = 0;
                createStringError<char_const*,unsigned_long,unsigned_int>
                          (EC_06,(char *)local_f0._M_cat,
                           (char **)
                           "%s table at offset 0x%lx has more offset entries (%u) than there is space for"
                           ,(unsigned_long *)&stack0xffffffffffffff08,(uint *)(OffsetPtr + 6));
              }
              else {
                DataExtractor::setAddressSize
                          (&Data.super_DataExtractor,*(uint8_t *)((long)OffsetPtr + 10));
                for (local_fc = 0; local_fc < *(uint *)((long)OffsetPtr + 0xc);
                    local_fc = local_fc + 1) {
                  local_108 = DWARFDataExtractor::getRelocatedValue
                                        (&Data,(uint)local_39,local_20,(uint64_t *)0x0,(Error *)0x0)
                  ;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (OffsetPtr + 2),&local_108);
                }
                Error::success();
                Error::Error((Error *)this,&local_110);
                ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_110);
              }
            }
            else {
              std::error_code::error_code<llvm::errc,void>(&local_d8,not_supported);
              local_e0 = StringRef::data((StringRef *)(OffsetPtr + 7));
              EC_05._M_cat._0_4_ = local_d8._M_value;
              EC_05._0_8_ = this;
              EC_05._M_cat._4_4_ = 0;
              createStringError<char_const*,unsigned_long,unsigned_char>
                        (EC_05,(char *)local_d8._M_cat,
                         (char **)
                         "%s table at offset 0x%lx has unsupported segment selector size %u",
                         (unsigned_long *)&local_e0,(uchar *)(OffsetPtr + 6));
            }
          }
          else {
            std::error_code::error_code<llvm::errc,void>(&local_c0,not_supported);
            local_c8 = StringRef::data((StringRef *)(OffsetPtr + 7));
            EC_04._M_cat._0_4_ = local_c0._M_value;
            EC_04._0_8_ = this;
            EC_04._M_cat._4_4_ = 0;
            createStringError<char_const*,unsigned_long,unsigned_char>
                      (EC_04,(char *)local_c0._M_cat,
                       (char **)"%s table at offset 0x%lx has unsupported address size %u",
                       (unsigned_long *)&local_c8,(uchar *)(OffsetPtr + 6));
          }
        }
        else {
          std::error_code::error_code<llvm::errc,void>(&local_a8,invalid_argument);
          local_b0 = StringRef::data((StringRef *)(OffsetPtr + 7));
          EC_03._M_cat._0_4_ = local_a8._M_value;
          EC_03._0_8_ = this;
          EC_03._M_cat._4_4_ = 0;
          createStringError<char_const*,unsigned_short,unsigned_long>
                    (EC_03,(char *)local_a8._M_cat,
                     (char **)"unrecognised %s table version %u in table at offset 0x%lx",
                     (unsigned_short *)&local_b0,OffsetPtr + 1);
        }
      }
      else {
        std::error_code::error_code<llvm::errc,void>(&local_90,invalid_argument);
        local_98 = StringRef::data((StringRef *)(OffsetPtr + 7));
        EC_02._M_cat._0_4_ = local_90._M_value;
        EC_02._0_8_ = this;
        EC_02._M_cat._4_4_ = 0;
        createStringError<char_const*,unsigned_long,unsigned_long>
                  (EC_02,(char *)local_90._M_cat,
                   (char **)
                   "section is not large enough to contain a %s table of length 0x%lx at offset 0x%lx"
                   ,(unsigned_long *)&local_98,&local_60);
      }
    }
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_30,invalid_argument);
    pcStack_38 = StringRef::data((StringRef *)(OffsetPtr + 7));
    EC._M_cat._0_4_ = local_30._M_value;
    EC._0_8_ = this;
    EC._M_cat._4_4_ = 0;
    createStringError<char_const*,unsigned_long>
              (EC,(char *)local_30._M_cat,
               (char **)"section is not large enough to contain a %s table length at offset 0x%lx",
               (unsigned_long *)&stack0xffffffffffffffc8);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListTableHeader::extract(DWARFDataExtractor Data,
                                    uint64_t *OffsetPtr) {
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       "%s table length at offset 0x%" PRIx64,
                       SectionName.data(), *OffsetPtr);
  Format = dwarf::DwarfFormat::DWARF32;
  uint8_t OffsetByteSize = 4;
  HeaderData.Length = Data.getRelocatedValue(4, OffsetPtr);
  if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
    Format = dwarf::DwarfFormat::DWARF64;
    OffsetByteSize = 8;
    HeaderData.Length = Data.getU64(OffsetPtr);
  } else if (HeaderData.Length >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64
        " has unsupported reserved unit length of value 0x%8.8" PRIx64,
        SectionName.data(), HeaderOffset, HeaderData.Length);
  }
  uint64_t FullLength =
      HeaderData.Length + dwarf::getUnitLengthFieldByteSize(Format);
  assert(FullLength == length());
  if (FullLength < getHeaderSize(Format))
    return createStringError(errc::invalid_argument,
                       "%s table at offset 0x%" PRIx64
                       " has too small length (0x%" PRIx64
                       ") to contain a complete header",
                       SectionName.data(), HeaderOffset, FullLength);
  uint64_t End = HeaderOffset + FullLength;
  if (!Data.isValidOffsetForDataOfSize(HeaderOffset, FullLength))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a %s table "
                       "of length 0x%" PRIx64 " at offset 0x%" PRIx64,
                       SectionName.data(), FullLength, HeaderOffset);

  HeaderData.Version = Data.getU16(OffsetPtr);
  HeaderData.AddrSize = Data.getU8(OffsetPtr);
  HeaderData.SegSize = Data.getU8(OffsetPtr);
  HeaderData.OffsetEntryCount = Data.getU32(OffsetPtr);

  // Perform basic validation of the remaining header fields.
  if (HeaderData.Version != 5)
    return createStringError(errc::invalid_argument,
                       "unrecognised %s table version %" PRIu16
                       " in table at offset 0x%" PRIx64,
                       SectionName.data(), HeaderData.Version, HeaderOffset);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.SegSize);
  if (End < HeaderOffset + getHeaderSize(Format) +
                HeaderData.OffsetEntryCount * OffsetByteSize)
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64 " has more offset entries (%" PRIu32
        ") than there is space for",
        SectionName.data(), HeaderOffset, HeaderData.OffsetEntryCount);
  Data.setAddressSize(HeaderData.AddrSize);
  for (uint32_t I = 0; I < HeaderData.OffsetEntryCount; ++I)
    Offsets.push_back(Data.getRelocatedValue(OffsetByteSize, OffsetPtr));
  return Error::success();
}